

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutoGeometry.h
# Opt level: O2

void __thiscall HACD::SimpleHull::SimpleHull(SimpleHull *this)

{
  this->mBoneIndex = 0;
  this->mParentIndex = -1;
  this->mVertexCount = 0;
  this->mVertices = (HaF32 *)0x0;
  this->mTriCount = 0;
  this->mIndices = (HaU32 *)0x0;
  this->mMeshVolume = 0.0;
  this->mBoneName = (char *)0x0;
  return;
}

Assistant:

SimpleHull(void)
		{
			mBoneIndex = 0;
			mVertexCount = 0;
			mVertices  = 0;
			mTriCount = 0;
			mIndices = 0;
			mMeshVolume = 0;
			mParentIndex = -1;
			mBoneName = 0;
		}